

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::VisitArguments(LinTerms *lt,function<void_(int)> *argv)

{
  ptr piVar1;
  long lVar2;
  long lVar3;
  _Vector_base<int,_std::allocator<int>_> local_48;
  ptr local_30;
  size_ty local_28;
  
  piVar1 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_28 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = local_28 << 2;
  local_30 = piVar1;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 4) {
    std::function<void_(int)>::operator()(argv,*(int *)((long)piVar1 + lVar2));
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void VisitArguments(const LinTerms& lt, std::function<void (int)> argv) {
  for (auto v: lt.vars())
    argv(v);
}